

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall
perfetto::TracingServiceImpl::ConsumerEndpointImpl::~ConsumerEndpointImpl
          (ConsumerEndpointImpl *this)

{
  (this->super_ConsumerEndpoint)._vptr_ConsumerEndpoint =
       (_func_int **)&PTR__ConsumerEndpointImpl_00408b30;
  DisconnectConsumer(this->service_,this);
  (*this->consumer_->_vptr_Consumer[3])();
  base::WeakPtrFactory<perfetto::TracingServiceImpl::ConsumerEndpointImpl>::~WeakPtrFactory
            (&this->weak_ptr_factory_);
  std::
  unique_ptr<perfetto::protos::gen::ObservableEvents,_std::default_delete<perfetto::protos::gen::ObservableEvents>_>
  ::~unique_ptr(&this->observable_events_);
  return;
}

Assistant:

TracingServiceImpl::ConsumerEndpointImpl::~ConsumerEndpointImpl() {
  service_->DisconnectConsumer(this);
  consumer_->OnDisconnect();
}